

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O2

void flatbuffers::tests::IntegerOutOfRangeTest(void)

{
  int in_R8D;
  char *in_R9;
  
  anon_unknown_0::TestError_
            ((anon_unknown_0 *)"table T { F:byte; } root_type T; { F:128 }","constant does not fit",
             (char *)0xb9,"void flatbuffers::tests::IntegerOutOfRangeTest()",in_R8D,in_R9);
  anon_unknown_0::TestError_
            ((anon_unknown_0 *)"table T { F:byte; } root_type T; { F:-129 }","constant does not fit"
             ,(char *)0xbb,"void flatbuffers::tests::IntegerOutOfRangeTest()",in_R8D,in_R9);
  anon_unknown_0::TestError_
            ((anon_unknown_0 *)"table T { F:ubyte; } root_type T; { F:256 }","constant does not fit"
             ,(char *)0xbd,"void flatbuffers::tests::IntegerOutOfRangeTest()",in_R8D,in_R9);
  anon_unknown_0::TestError_
            ((anon_unknown_0 *)"table T { F:ubyte; } root_type T; { F:-1 }","constant does not fit",
             (char *)0xbf,"void flatbuffers::tests::IntegerOutOfRangeTest()",in_R8D,in_R9);
  anon_unknown_0::TestError_
            ((anon_unknown_0 *)"table T { F:short; } root_type T; { F:32768 }",
             "constant does not fit",(char *)0xc1,"void flatbuffers::tests::IntegerOutOfRangeTest()"
             ,in_R8D,in_R9);
  anon_unknown_0::TestError_
            ((anon_unknown_0 *)"table T { F:short; } root_type T; { F:-32769 }",
             "constant does not fit",(char *)0xc3,"void flatbuffers::tests::IntegerOutOfRangeTest()"
             ,in_R8D,in_R9);
  anon_unknown_0::TestError_
            ((anon_unknown_0 *)"table T { F:ushort; } root_type T; { F:65536 }",
             "constant does not fit",(char *)0xc5,"void flatbuffers::tests::IntegerOutOfRangeTest()"
             ,in_R8D,in_R9);
  anon_unknown_0::TestError_
            ((anon_unknown_0 *)"table T { F:ushort; } root_type T; { F:-1 }","constant does not fit"
             ,(char *)0xc7,"void flatbuffers::tests::IntegerOutOfRangeTest()",in_R8D,in_R9);
  anon_unknown_0::TestError_
            ((anon_unknown_0 *)"table T { F:int; } root_type T; { F:2147483648 }",
             "constant does not fit",(char *)0xc9,"void flatbuffers::tests::IntegerOutOfRangeTest()"
             ,in_R8D,in_R9);
  anon_unknown_0::TestError_
            ((anon_unknown_0 *)"table T { F:int; } root_type T; { F:-2147483649 }",
             "constant does not fit",(char *)0xcb,"void flatbuffers::tests::IntegerOutOfRangeTest()"
             ,in_R8D,in_R9);
  anon_unknown_0::TestError_
            ((anon_unknown_0 *)"table T { F:uint; } root_type T; { F:4294967296 }",
             "constant does not fit",(char *)0xcd,"void flatbuffers::tests::IntegerOutOfRangeTest()"
             ,in_R8D,in_R9);
  anon_unknown_0::TestError_
            ((anon_unknown_0 *)"table T { F:uint; } root_type T; { F:-1 }","constant does not fit",
             (char *)0xcf,"void flatbuffers::tests::IntegerOutOfRangeTest()",in_R8D,in_R9);
  anon_unknown_0::TestError_
            ((anon_unknown_0 *)"table X { Y:uint8; } root_type X; { Y: -1 }","does not fit",
             (char *)0xd1,"void flatbuffers::tests::IntegerOutOfRangeTest()",in_R8D,in_R9);
  anon_unknown_0::TestError_
            ((anon_unknown_0 *)"table X { Y:uint8; } root_type X; { Y: 256 }","does not fit",
             (char *)0xd2,"void flatbuffers::tests::IntegerOutOfRangeTest()",in_R8D,in_R9);
  anon_unknown_0::TestError_
            ((anon_unknown_0 *)"table X { Y:uint16; } root_type X; { Y: -1 }","does not fit",
             (char *)0xd3,"void flatbuffers::tests::IntegerOutOfRangeTest()",in_R8D,in_R9);
  anon_unknown_0::TestError_
            ((anon_unknown_0 *)"table X { Y:uint16; } root_type X; { Y: 65536 }","does not fit",
             (char *)0xd4,"void flatbuffers::tests::IntegerOutOfRangeTest()",in_R8D,in_R9);
  anon_unknown_0::TestError_
            ((anon_unknown_0 *)"table X { Y:uint32; } root_type X; { Y: -1 }","",(char *)0xd5,
             "void flatbuffers::tests::IntegerOutOfRangeTest()",in_R8D,in_R9);
  anon_unknown_0::TestError_
            ((anon_unknown_0 *)"table X { Y:uint32; } root_type X; { Y: 4294967296 }","does not fit"
             ,(char *)0xd7,"void flatbuffers::tests::IntegerOutOfRangeTest()",in_R8D,in_R9);
  anon_unknown_0::TestError_
            ((anon_unknown_0 *)"table X { Y:uint64; } root_type X; { Y: -1 }","",(char *)0xd8,
             "void flatbuffers::tests::IntegerOutOfRangeTest()",in_R8D,in_R9);
  anon_unknown_0::TestError_
            ((anon_unknown_0 *)"table X { Y:uint64; } root_type X; { Y: -9223372036854775809 }",
             "does not fit",(char *)0xda,"void flatbuffers::tests::IntegerOutOfRangeTest()",in_R8D,
             in_R9);
  anon_unknown_0::TestError_
            ((anon_unknown_0 *)"table X { Y:uint64; } root_type X; { Y: 18446744073709551616 }",
             "does not fit",(char *)0xdc,"void flatbuffers::tests::IntegerOutOfRangeTest()",in_R8D,
             in_R9);
  anon_unknown_0::TestError_
            ((anon_unknown_0 *)"table X { Y:int8; } root_type X; { Y: -129 }","does not fit",
             (char *)0xde,"void flatbuffers::tests::IntegerOutOfRangeTest()",in_R8D,in_R9);
  anon_unknown_0::TestError_
            ((anon_unknown_0 *)"table X { Y:int8; } root_type X; { Y: 128 }","does not fit",
             (char *)0xdf,"void flatbuffers::tests::IntegerOutOfRangeTest()",in_R8D,in_R9);
  anon_unknown_0::TestError_
            ((anon_unknown_0 *)"table X { Y:int16; } root_type X; { Y: -32769 }","does not fit",
             (char *)0xe0,"void flatbuffers::tests::IntegerOutOfRangeTest()",in_R8D,in_R9);
  anon_unknown_0::TestError_
            ((anon_unknown_0 *)"table X { Y:int16; } root_type X; { Y: 32768 }","does not fit",
             (char *)0xe1,"void flatbuffers::tests::IntegerOutOfRangeTest()",in_R8D,in_R9);
  anon_unknown_0::TestError_
            ((anon_unknown_0 *)"table X { Y:int32; } root_type X; { Y: -2147483649 }","",
             (char *)0xe2,"void flatbuffers::tests::IntegerOutOfRangeTest()",in_R8D,in_R9);
  anon_unknown_0::TestError_
            ((anon_unknown_0 *)"table X { Y:int32; } root_type X; { Y: 2147483648 }","does not fit",
             (char *)0xe4,"void flatbuffers::tests::IntegerOutOfRangeTest()",in_R8D,in_R9);
  anon_unknown_0::TestError_
            ((anon_unknown_0 *)"table X { Y:int64; } root_type X; { Y: -9223372036854775809 }",
             "does not fit",(char *)0xe6,"void flatbuffers::tests::IntegerOutOfRangeTest()",in_R8D,
             in_R9);
  anon_unknown_0::TestError_
            ((anon_unknown_0 *)"table X { Y:int64; } root_type X; { Y: 9223372036854775808 }",
             "does not fit",(char *)0xe8,"void flatbuffers::tests::IntegerOutOfRangeTest()",in_R8D,
             in_R9);
  anon_unknown_0::TestError_
            ((anon_unknown_0 *)"table X { Y:int8; } root_type X; { Y: -9223372036854775809 }",
             "does not fit",(char *)0xeb,"void flatbuffers::tests::IntegerOutOfRangeTest()",in_R8D,
             in_R9);
  anon_unknown_0::TestError_
            ((anon_unknown_0 *)"table X { Y:int8; } root_type X; { Y: 9223372036854775808 }",
             "does not fit",(char *)0xed,"void flatbuffers::tests::IntegerOutOfRangeTest()",in_R8D,
             in_R9);
  anon_unknown_0::TestError_
            ((anon_unknown_0 *)"table X { Y:int64=-9223372036854775809; } root_type X; {}",
             "does not fit",(char *)0xf1,"void flatbuffers::tests::IntegerOutOfRangeTest()",in_R8D,
             in_R9);
  anon_unknown_0::TestError_
            ((anon_unknown_0 *)"table X { Y:int64= 9223372036854775808; } root_type X; {}",
             "does not fit",(char *)0xf3,"void flatbuffers::tests::IntegerOutOfRangeTest()",in_R8D,
             in_R9);
  anon_unknown_0::TestError_
            ((anon_unknown_0 *)"table X { Y:uint64; } root_type X; { Y: -1 }","",(char *)0xf4,
             "void flatbuffers::tests::IntegerOutOfRangeTest()",in_R8D,in_R9);
  anon_unknown_0::TestError_
            ((anon_unknown_0 *)"table X { Y:uint64=-9223372036854775809; } root_type X; {}",
             "does not fit",(char *)0xf6,"void flatbuffers::tests::IntegerOutOfRangeTest()",in_R8D,
             in_R9);
  anon_unknown_0::TestError_
            ((anon_unknown_0 *)"table X { Y:uint64= 18446744073709551616; } root_type X; {}",
             "does not fit",(char *)0xf8,"void flatbuffers::tests::IntegerOutOfRangeTest()",in_R8D,
             in_R9);
  return;
}

Assistant:

void IntegerOutOfRangeTest() {
  TestError("table T { F:byte; } root_type T; { F:128 }",
            "constant does not fit");
  TestError("table T { F:byte; } root_type T; { F:-129 }",
            "constant does not fit");
  TestError("table T { F:ubyte; } root_type T; { F:256 }",
            "constant does not fit");
  TestError("table T { F:ubyte; } root_type T; { F:-1 }",
            "constant does not fit");
  TestError("table T { F:short; } root_type T; { F:32768 }",
            "constant does not fit");
  TestError("table T { F:short; } root_type T; { F:-32769 }",
            "constant does not fit");
  TestError("table T { F:ushort; } root_type T; { F:65536 }",
            "constant does not fit");
  TestError("table T { F:ushort; } root_type T; { F:-1 }",
            "constant does not fit");
  TestError("table T { F:int; } root_type T; { F:2147483648 }",
            "constant does not fit");
  TestError("table T { F:int; } root_type T; { F:-2147483649 }",
            "constant does not fit");
  TestError("table T { F:uint; } root_type T; { F:4294967296 }",
            "constant does not fit");
  TestError("table T { F:uint; } root_type T; { F:-1 }",
            "constant does not fit");
  // Check fixed width aliases
  TestError("table X { Y:uint8; } root_type X; { Y: -1 }", "does not fit");
  TestError("table X { Y:uint8; } root_type X; { Y: 256 }", "does not fit");
  TestError("table X { Y:uint16; } root_type X; { Y: -1 }", "does not fit");
  TestError("table X { Y:uint16; } root_type X; { Y: 65536 }", "does not fit");
  TestError("table X { Y:uint32; } root_type X; { Y: -1 }", "");
  TestError("table X { Y:uint32; } root_type X; { Y: 4294967296 }",
            "does not fit");
  TestError("table X { Y:uint64; } root_type X; { Y: -1 }", "");
  TestError("table X { Y:uint64; } root_type X; { Y: -9223372036854775809 }",
            "does not fit");
  TestError("table X { Y:uint64; } root_type X; { Y: 18446744073709551616 }",
            "does not fit");

  TestError("table X { Y:int8; } root_type X; { Y: -129 }", "does not fit");
  TestError("table X { Y:int8; } root_type X; { Y: 128 }", "does not fit");
  TestError("table X { Y:int16; } root_type X; { Y: -32769 }", "does not fit");
  TestError("table X { Y:int16; } root_type X; { Y: 32768 }", "does not fit");
  TestError("table X { Y:int32; } root_type X; { Y: -2147483649 }", "");
  TestError("table X { Y:int32; } root_type X; { Y: 2147483648 }",
            "does not fit");
  TestError("table X { Y:int64; } root_type X; { Y: -9223372036854775809 }",
            "does not fit");
  TestError("table X { Y:int64; } root_type X; { Y: 9223372036854775808 }",
            "does not fit");
  // check out-of-int64 as int8
  TestError("table X { Y:int8; } root_type X; { Y: -9223372036854775809 }",
            "does not fit");
  TestError("table X { Y:int8; } root_type X; { Y: 9223372036854775808 }",
            "does not fit");

  // Check default values
  TestError("table X { Y:int64=-9223372036854775809; } root_type X; {}",
            "does not fit");
  TestError("table X { Y:int64= 9223372036854775808; } root_type X; {}",
            "does not fit");
  TestError("table X { Y:uint64; } root_type X; { Y: -1 }", "");
  TestError("table X { Y:uint64=-9223372036854775809; } root_type X; {}",
            "does not fit");
  TestError("table X { Y:uint64= 18446744073709551616; } root_type X; {}",
            "does not fit");
}